

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O1

void __thiscall wasm::CodeFolding::visitBreak(CodeFolding *this,Break *curr)

{
  pointer *ppTVar1;
  Block *pBVar2;
  size_t sVar3;
  iterator __position;
  Expression **ppEVar4;
  mapped_type *this_00;
  Tail local_38;
  
  if (curr->condition == (Expression *)0x0) {
    ppEVar4 = SmallVector<wasm::Expression_*,_10UL>::back
                        (&(this->
                          super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>_>
                          ).
                          super_ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
                          .controlFlowStack);
    pBVar2 = (Block *)*ppEVar4;
    if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id == BlockId)
    {
      sVar3 = (pBVar2->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      if (sVar3 == 0) {
        __assert_fail("usedElements > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xd0,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      if ((Break *)(pBVar2->list).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                   [sVar3 - 1] == curr) {
        this_00 = std::
                  map<wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>_>_>
                  ::operator[](&this->breakTails,&curr->name);
        local_38.pointer = (Expression **)0x0;
        __position._M_current =
             (this_00->
             super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this_00->
            super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_38.expr = (Expression *)curr;
          local_38.block = pBVar2;
          std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
          _M_realloc_insert<wasm::CodeFolding::Tail>(this_00,__position,&local_38);
        }
        else {
          (__position._M_current)->pointer = (Expression **)0x0;
          (__position._M_current)->expr = (Expression *)curr;
          (__position._M_current)->block = pBVar2;
          ppTVar1 = &(this_00->
                     super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + 1;
        }
        return;
      }
    }
  }
  std::
  _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
  ::_M_insert_unique<wasm::Name_const&>
            ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
              *)&this->unoptimizables,&curr->name);
  return;
}

Assistant:

void visitBreak(Break* curr) {
    if (curr->condition) {
      unoptimizables.insert(curr->name);
    } else {
      // we can only optimize if we are at the end of the parent block.
      // TODO: Relax this.
      Block* parent = controlFlowStack.back()->dynCast<Block>();
      if (parent && curr == parent->list.back()) {
        breakTails[curr->name].push_back(Tail(curr, parent));
      } else {
        unoptimizables.insert(curr->name);
      }
    }
  }